

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O1

void TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  pair<int,_long> *ppVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int d;
  long lVar16;
  
  TPZShapeH1<pzshape::TPZShapeCube>::Shape(pt,data);
  if (0 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements) {
    lVar12 = 0;
    lVar9 = 0;
    do {
      ppVar2 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
      iVar1 = ppVar2[lVar9].first;
      lVar10 = (long)iVar1;
      iVar6 = (int)ppVar2[lVar9].second;
      lVar14 = (long)iVar6;
      lVar16 = 0;
      do {
        if (((lVar14 < 0) ||
            ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
             <= lVar14)) ||
           ((data->fPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
            1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow <= lVar16) || (iVar1 < 0)) ||
           ((data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
            super_TPZBaseMatrix.fCol <= lVar10)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
           ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)phi->fElem +
         lVar16 * 8 + (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12) =
             (data->fPhi).super_TPZFMatrix<double>.fElem[lVar14] *
             (data->fMasterDirections).super_TPZFMatrix<double>.fElem
             [(data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fRow * lVar10 + lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      uVar15 = 2;
      lVar14 = 0;
      do {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar15;
        lVar8 = (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe) * -0xc + 0x10;
        lVar16 = lVar14 + 1;
        lVar7 = 0;
        if (lVar14 != 2) {
          lVar7 = lVar16;
        }
        lVar11 = (data->fDPhi).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                 fRow * (long)iVar6;
        pdVar3 = (data->fDPhi).super_TPZFMatrix<double>.fElem;
        lVar13 = (data->fMasterDirections).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                 super_TPZBaseMatrix.fRow * lVar10;
        pdVar4 = (data->fMasterDirections).super_TPZFMatrix<double>.fElem;
        if (((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar14) ||
           ((curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)
         ((long)curlphi->fElem +
         lVar14 * 8 + (curlphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar12) =
             pdVar3[lVar11 + lVar7] * *(double *)((long)pdVar4 + lVar14 * 8 + lVar8 + lVar13 * 8) -
             pdVar4[lVar13 + lVar7] * *(double *)((long)pdVar3 + lVar14 * 8 + lVar8 + lVar11 * 8);
        uVar15 = uVar15 + 1;
        lVar14 = lVar16;
      } while (lVar16 != 3);
      lVar9 = lVar9 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar9 < (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements);
  }
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        const auto &it = data.fSDVecShapeIndex[i];
        const int vecindex = it.first;
        const int scalindex = it.second;
        
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
        }

        if constexpr (dim==1){
            curlphi(0,i) =
                data.fDPhi.GetVal( 0,vecindex) *
                data.fMasterDirections.GetVal(0,vecindex);
        }else if constexpr (dim==2){
            curlphi(0,i) =
                data.fDPhi.GetVal(0,scalindex) *
                data.fMasterDirections.GetVal(1,vecindex) -
                data.fDPhi.GetVal(1,scalindex) *
                data.fMasterDirections.GetVal(0,vecindex);
            }
        else if constexpr(dim==3){
            for(auto d = 0; d < dim; d++) {
                const auto di = (d+1)%dim;
                const auto dj = (d+2)%dim;
                curlphi(d,i) =
                    data.fDPhi.GetVal(di,scalindex) *
                    data.fMasterDirections.GetVal(dj,vecindex)-
                    data.fDPhi.GetVal(dj,scalindex) *
                    data.fMasterDirections.GetVal(di,vecindex);
            }
        }else{
            if constexpr (std::is_same_v<TSHAPE,TSHAPE>){
                static_assert(!sizeof(TSHAPE),"Invalid curl dimension");
            }
        }        
    }
}